

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_send_recv.c
# Opt level: O3

int kvT_send_recv(int rank,int ranks)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  int val_of_three;
  int val_of_two;
  int val_of_one;
  kvtree *recv;
  kvtree *send;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  long local_30;
  
  lVar2 = kvtree_new();
  local_30 = lVar2;
  lVar3 = kvtree_new();
  if (rank == 0) {
    pcVar5 = "ONE";
    uVar4 = 1;
  }
  else if (rank == 1) {
    pcVar5 = "TWO";
    uVar4 = 2;
  }
  else {
    pcVar5 = "THREE";
    uVar4 = 3;
  }
  local_38 = lVar3;
  kvtree_util_set_int(lVar2,pcVar5,uVar4);
  iVar1 = kvtree_sendrecv(lVar2,(long)(rank + 1) % (long)ranks & 0xffffffff,lVar3,
                          (long)(rank + ranks + -1) % (long)ranks & 0xffffffff,&ompi_mpi_comm_world)
  ;
  if (iVar1 != 0) {
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    uVar4 = 0xa0;
    goto LAB_00101861;
  }
  if (rank == 0) {
    iVar1 = kvtree_util_get_int(lVar2,"ONE",&local_3c);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read send value of \'ONE\'");
      uVar4 = 0xa7;
      goto LAB_00101861;
    }
    if (local_3c != 1) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      uVar4 = 0xac;
      goto LAB_00101861;
    }
    iVar1 = kvtree_util_get_int(lVar3,"THREE",&local_44);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'THREE\'");
      uVar4 = 0xb2;
      goto LAB_00101861;
    }
    if (local_44 != 3) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar4 = 0xb7;
      goto LAB_00101861;
    }
  }
  else if (rank == 2) {
    iVar1 = kvtree_util_get_int(lVar2,"THREE",&local_44);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read send value of \'THREE\'");
      uVar4 = 0xd7;
      goto LAB_00101861;
    }
    if (local_44 != 3) {
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      uVar4 = 0xdc;
      goto LAB_00101861;
    }
    iVar1 = kvtree_util_get_int(lVar3,"TWO",&local_40);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of \'TWO\'");
      uVar4 = 0xe2;
      goto LAB_00101861;
    }
    if (local_40 != 2) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar4 = 0xe7;
      goto LAB_00101861;
    }
  }
  else if (rank == 1) {
    iVar1 = kvtree_util_get_int(lVar2,"TWO",&local_40);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 1 could not read send value of \'TWO\'");
      uVar4 = 0xbf;
      goto LAB_00101861;
    }
    if (local_40 != 2) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      uVar4 = 0xc4;
      goto LAB_00101861;
    }
    iVar1 = kvtree_util_get_int(lVar3,"ONE",&local_3c);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'ONE\'");
      uVar4 = 0xca;
      goto LAB_00101861;
    }
    if (local_3c != 1) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar4 = 0xcf;
      goto LAB_00101861;
    }
  }
  printf("rank = %d\n",(ulong)(uint)rank);
  puts("SEND HASH");
  kvtree_print(lVar2,4);
  puts("RECEIVE HASH");
  kvtree_print(lVar3,4);
  kvtree_delete(&local_30);
  if (local_30 == 0) {
    kvtree_delete(&local_38);
    if (local_38 == 0) {
      return 0;
    }
    printf("test_kvtree_send_recv, deletion of recv failed");
    uVar4 = 0xfc;
  }
  else {
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    uVar4 = 0xf6;
  }
LAB_00101861:
  printf("Error in line %d, file %s, function %s.\n",uVar4,
         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
         ,"kvT_send_recv");
  return 1;
}

Assistant:

int kvT_send_recv(int rank, int ranks){
  int kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();
  if(rank == 0)
    kvtree_util_set_int(send, "ONE", 1);
  else if(rank == 1) 
    kvtree_util_set_int(send, "TWO", 2);
  else
    kvtree_util_set_int(send, "THREE", 3);
// with ranks in a circular queue, send to 1 rank forward, receive from 1 rank back
  kvtree_rc = kvtree_sendrecv(send, (rank+1) % ranks, recv, (rank-1+ranks) % ranks, MPI_COMM_WORLD);
  if(kvtree_rc != TEST_PASS){
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(send, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read send value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 1){
    kvtree_rc = kvtree_util_get_int(send, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 1 could not read send value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(send, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read send value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }

  printf("rank = %d\n", rank);
  printf("SEND HASH\n");
  kvtree_print(send, 4);
  printf("RECEIVE HASH\n");
  kvtree_print(recv, 4);
 
  
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("test_kvtree_send_recv, deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }

  return TEST_PASS;
}